

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O3

SHADER_STATUS __thiscall
Diligent::ShaderGLImpl::GetStatus(ShaderGLImpl *this,bool WaitForCompletion)

{
  ShaderBuilder *this_00;
  bool bVar1;
  
  this_00 = (this->m_Builder)._M_t.
            super___uniq_ptr_impl<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
            .super__Head_base<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_false>._M_head_impl;
  if (this_00 != (ShaderBuilder *)0x0) {
    bVar1 = ShaderBuilder::Tick(this_00,WaitForCompletion);
    if (bVar1) {
      std::
      __uniq_ptr_impl<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
      ::reset((__uniq_ptr_impl<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
               *)&this->m_Builder,(pointer)0x0);
    }
    if ((this->m_Builder)._M_t.
        super___uniq_ptr_impl<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
        ._M_t.
        super__Tuple_impl<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
        .super__Head_base<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_false>._M_head_impl !=
        (ShaderBuilder *)0x0) {
      return SHADER_STATUS_COMPILING;
    }
  }
  return ((this->m_GLShaderObj).m_uiHandle == 0) + SHADER_STATUS_READY;
}

Assistant:

SHADER_STATUS ShaderGLImpl::GetStatus(bool WaitForCompletion)
{
    if (m_Builder)
    {
        if (m_Builder->Tick(WaitForCompletion))
        {
            m_Builder.reset();
        }
    }
    return m_Builder ? SHADER_STATUS_COMPILING : (m_GLShaderObj ? SHADER_STATUS_READY : SHADER_STATUS_FAILED);
}